

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

xmlChar * xml_secure_vprint(char *format,__va_list_tag *ap)

{
  FILE *pFVar1;
  uint uVar2;
  char *pcVar3;
  size_t __size;
  xmlChar *pxVar4;
  undefined8 *in_RSI;
  char *in_RDI;
  xmlChar *xml_msg;
  size_t msglen;
  int res;
  va_list ap_store;
  size_t len;
  char *msg;
  char buf [100];
  undefined8 local_a8;
  undefined8 uStackY_a0;
  undefined8 local_98;
  char *in_stack_ffffffffffffff70;
  char *local_80;
  char local_78 [104];
  undefined8 *local_10;
  char *local_8;
  
  local_80 = local_78;
  local_98 = in_RSI[2];
  local_a8 = *in_RSI;
  uStackY_a0 = in_RSI[1];
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = vsnprintf(local_80,100,in_RDI,&local_a8);
  pFVar1 = _stderr;
  if ((int)uVar2 < 0) {
    pcVar3 = strerror(uVar2);
    fprintf(pFVar1,"vsnprintf failed in xml_secure_vprint: %s\n",pcVar3);
    exit(1);
  }
  if (99 < uVar2) {
    __size = (size_t)(int)(uVar2 + 1);
    local_80 = (char *)malloc(__size);
    if (local_80 == (char *)0x0) {
      fprintf(_stderr,"memory allocation failure in xml_secure_vprint\n");
      exit(1);
    }
    uVar2 = vsnprintf(local_80,__size,local_8,local_10);
    if ((int)uVar2 < 0) {
      free(local_80);
      pFVar1 = _stderr;
      pcVar3 = strerror(uVar2);
      fprintf(pFVar1,"vsnprintf failed in xml_secure_vprint: %s\n",pcVar3);
      exit(1);
    }
    if (__size <= uVar2) {
      free(local_80);
      fprintf(_stderr,"vsnprintf failed in xml_secure_vprint: nondeterministic message length\n");
      exit(1);
    }
  }
  pxVar4 = xmlEscapePropValue(in_stack_ffffffffffffff70);
  if (local_80 != local_78) {
    free(local_80);
  }
  return pxVar4;
}

Assistant:

static xmlChar* xml_secure_vprint(const char *format, va_list ap)
{
    char buf[100];
    char *msg = buf;
    const size_t len = sizeof(buf);

    va_list ap_store;
    va_copy(ap_store, ap);
    int res = vsnprintf(msg, len, format, ap_store);
    va_end(ap_store);
    if (res < 0) {
        fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
        exit(EXIT_FAILURE);
    }

    if ((unsigned)res >= len) {
        size_t msglen = res+1;
        msg = malloc(msglen);
        if (!msg) {
            fprintf(stderr, "memory allocation failure in xml_secure_vprint\n");
            exit(EXIT_FAILURE);
        }
        res = vsnprintf(msg, msglen, format, ap);
        if (res < 0) {
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: %s\n", strerror(res));
            exit(EXIT_FAILURE);
        }
        if ((unsigned)res >= msglen) {
            // What? Did format get longer while allocating msg?
            free(msg);
            fprintf(stderr, "vsnprintf failed in xml_secure_vprint: nondeterministic message length\n");
            exit(EXIT_FAILURE);
        }
    }

    xmlChar *xml_msg = xmlEscapePropValue(msg);
    if (msg != buf) free(msg);
    return xml_msg;
}